

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void pnga_shift_diagonal(Integer g_a,void *c)

{
  undefined1 auVar1 [16];
  double dVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int *piVar7;
  float *pfVar8;
  long *plVar9;
  double *pdVar10;
  char *pcVar11;
  long lVar12;
  undefined1 (*pauVar13) [16];
  bool bVar14;
  char *ptr;
  Integer ld;
  Integer hiA [2];
  Integer loA [2];
  Integer atype;
  Integer andim;
  Integer adims [2];
  _iterator_hdl hdl;
  char *local_388;
  long local_380;
  long local_378;
  long local_370;
  long local_368;
  long local_360;
  Integer local_358;
  long local_350;
  Integer local_348 [3];
  _iterator_hdl local_330;
  long lVar6;
  
  pnga_nodeid();
  pnga_nnodes();
  iVar3 = _ga_sync_end;
  bVar14 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar14) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_shift_diagonal_");
  pnga_inquire(g_a,&local_358,&local_350,local_348);
  if (local_350 != 2) {
    pnga_error("Dimension must be 2 for shift diagonal operation",local_350);
  }
  pnga_local_iterator_init(g_a,&local_330);
  iVar4 = pnga_local_iterator_next(&local_330,&local_368,&local_378,&local_388,&local_380);
  if (iVar4 != 0) {
    do {
      if (0 < local_368) {
        lVar12 = local_360;
        if (local_360 < local_368) {
          lVar12 = local_368;
        }
        lVar6 = local_370;
        if (local_378 < local_370) {
          lVar6 = local_378;
        }
        lVar5 = lVar6 - lVar12;
        if (lVar12 <= lVar6) {
          switch(local_358) {
          case 0x3e9:
            piVar7 = (int *)(local_388 +
                            (lVar12 - local_360) * local_380 * 4 + (lVar12 - local_368) * 4);
            lVar5 = lVar5 + 1;
            do {
              *piVar7 = *piVar7 + *c;
              piVar7 = piVar7 + local_380 + 1;
              lVar5 = lVar5 + -1;
            } while (lVar5 != 0);
            break;
          case 0x3ea:
            plVar9 = (long *)(local_388 +
                             (lVar12 - local_360) * local_380 * 8 + (lVar12 - local_368) * 8);
            lVar5 = lVar5 + 1;
            do {
              *plVar9 = *plVar9 + *c;
              plVar9 = plVar9 + local_380 + 1;
              lVar5 = lVar5 + -1;
            } while (lVar5 != 0);
            break;
          case 0x3eb:
            pfVar8 = (float *)(local_388 +
                              (lVar12 - local_360) * local_380 * 4 + (lVar12 - local_368) * 4);
            lVar5 = lVar5 + 1;
            do {
              *pfVar8 = *c + *pfVar8;
              pfVar8 = pfVar8 + local_380 + 1;
              lVar5 = lVar5 + -1;
            } while (lVar5 != 0);
            break;
          case 0x3ec:
            pdVar10 = (double *)
                      (local_388 + (lVar12 - local_360) * local_380 * 8 + (lVar12 - local_368) * 8);
            lVar5 = lVar5 + 1;
            do {
              *pdVar10 = *c + *pdVar10;
              pdVar10 = pdVar10 + local_380 + 1;
              lVar5 = lVar5 + -1;
            } while (lVar5 != 0);
            break;
          default:
            pnga_error("ga_shift_diagonal_: wrong data type:",local_358);
            break;
          case 0x3ee:
            pcVar11 = local_388 + (lVar12 - local_360) * local_380 * 8 + (lVar12 - local_368) * 8;
            lVar5 = lVar5 + 1;
            do {
              *(ulong *)pcVar11 =
                   CONCAT44((float)((ulong)*(undefined8 *)pcVar11 >> 0x20) +
                            (float)((ulong)*c >> 0x20),(float)*(undefined8 *)pcVar11 + (float)*c);
              pcVar11 = pcVar11 + local_380 * 8 + 8;
              lVar5 = lVar5 + -1;
            } while (lVar5 != 0);
            break;
          case 0x3ef:
            pauVar13 = (undefined1 (*) [16])
                       (local_388 +
                       (lVar12 - local_360) * local_380 * 0x10 + (lVar12 - local_368) * 0x10);
            lVar5 = lVar5 + 1;
            do {
              dVar2 = *(double *)(*pauVar13 + 8) + *(double *)((long)c + 8);
              auVar1._8_4_ = SUB84(dVar2,0);
              auVar1._0_8_ = *(double *)*pauVar13 + *c;
              auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
              *pauVar13 = auVar1;
              pauVar13 = pauVar13 + local_380 + 1;
              lVar5 = lVar5 + -1;
            } while (lVar5 != 0);
          }
        }
      }
      iVar4 = pnga_local_iterator_next(&local_330,&local_368,&local_378,&local_388,&local_380);
    } while (iVar4 != 0);
  }
  if (iVar3 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_shift_diagonal(Integer g_a, void *c)
{
  Integer loA[2], hiA[2]/*, dim1, dim2*/, ld;
  Integer andim, adims[2], type, atype;
  Integer me = pnga_nodeid (), i, nproc = pnga_nnodes();
  char *ptr;
  Integer num_blocks_a;
  int local_sync_begin,local_sync_end;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_shift_diagonal_");

  pnga_inquire (g_a, &atype, &andim, adims);
  /*dim1 = adims[0];*/
  /*dim2 = adims[1];*/
  type = atype;
  if (andim != 2) 
    pnga_error("Dimension must be 2 for shift diagonal operation",andim);

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&ptr,&ld)) {
    sgai_shift_diagonal_block(g_a, ptr, loA, hiA, ld, c, type);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution(g_a, me, loA, hiA);
    pnga_access_ptr(g_a, loA, hiA, &ptr, &ld);
    sgai_shift_diagonal_block(g_a, ptr, loA, hiA, ld, c, type);
    pnga_release_update(g_a, loA, hiA);
  } else {
    Integer idx;
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, loA, hiA);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_shift_diagonal_block(g_a, ptr, loA, hiA, ld, c, type);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer chk;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[andim-1] < blocks[andim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < andim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > adims[i]) hiA[i] = adims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_shift_diagonal_block(g_a, ptr, loA, hiA, ld, c, type);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < andim; i++) {
          if (index[i] >= blocks[i] && i<andim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif
  if(local_sync_end)pnga_sync();
}